

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_block_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_11af45a::ErrorBlockTest_DISABLED_Speed_Test::TestBody
          (ErrorBlockTest_DISABLED_Speed_Test *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ACMRandom *in_RDI;
  int elapsed_time_simd;
  int iter_1;
  int elapsed_time_c;
  int iter;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  int j;
  int k;
  int i;
  int msb;
  int64_t ref_ssz;
  int num_iters;
  int64_t ssz;
  intptr_t block_size;
  tran_low_t dqcoeff [4096];
  tran_low_t coeff [4096];
  ACMRandom rnd;
  int in_stack_ffffffffffff7f5c;
  int local_8094;
  int local_808c;
  aom_usec_timer local_8088;
  aom_usec_timer local_8068;
  int local_8048;
  int local_8044;
  int local_8040;
  int local_803c;
  undefined1 local_8038 [12];
  int local_802c;
  undefined1 local_8028 [8];
  long local_8020;
  int local_8018 [4096];
  int local_4018 [4102];
  
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::ACMRandom(in_RDI,in_stack_ffffffffffff7f5c);
  local_802c = 100000;
  local_803c = in_RDI[6].random_.state_ + 7;
  for (local_8040 = 0; local_8040 < 9; local_8040 = local_8040 + 1) {
    local_8020 = (long)(0x10 << ((byte)((long)local_8040 % 9) & 0x1f));
    for (local_8044 = 0; local_8044 < 9; local_8044 = local_8044 + 1) {
      for (local_8048 = 0; local_8048 < local_8020; local_8048 = local_8048 + 1) {
        if (local_8044 < 5) {
          iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
          if (iVar1 == 0) {
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_4018[local_8048] = -iVar1;
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_8018[local_8048] = -iVar1;
          }
          else {
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_4018[local_8048] = iVar1;
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_8018[local_8048] = iVar1;
          }
        }
        else {
          iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
          if (iVar1 == 0) {
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_4018[local_8048] = -iVar1;
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_8018[local_8048] = -iVar1;
          }
          else {
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_4018[local_8048] = iVar1;
            iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffff7f5c);
            local_8018[local_8048] = iVar1;
          }
        }
      }
      ::aom_usec_timer_start((aom_usec_timer *)0xb1cc6a);
      for (local_808c = 0; local_808c < local_802c; local_808c = local_808c + 1) {
        (**(code **)(in_RDI + 10))
                  (local_4018,local_8018,local_8020,local_8038,in_RDI[6].random_.state_);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0xb1ccbf);
      uVar2 = ::aom_usec_timer_elapsed(&local_8068);
      ::aom_usec_timer_start((aom_usec_timer *)0xb1ccd7);
      for (local_8094 = 0; local_8094 < local_802c; local_8094 = local_8094 + 1) {
        (**(code **)(in_RDI + 8))
                  (local_4018,local_8018,local_8020,local_8028,in_RDI[6].random_.state_);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0xb1cd2f);
      uVar3 = ::aom_usec_timer_elapsed(&local_8088);
      in_stack_ffffffffffff7f5c = (int)uVar3;
      printf(" c_time=%d \t simd_time=%d \t gain=%d \n",uVar2 & 0xffffffff,uVar3 & 0xffffffff);
    }
  }
  return;
}

Assistant:

TEST_P(ErrorBlockTest, DISABLED_Speed) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  DECLARE_ALIGNED(16, tran_low_t, coeff[4096]);
  DECLARE_ALIGNED(16, tran_low_t, dqcoeff[4096]);
  intptr_t block_size;
  int64_t ssz;
  int num_iters = 100000;
  int64_t ref_ssz;
  const int msb = bit_depth_ + 8 - 1;
  for (int i = 0; i < 9; ++i) {
    block_size = 16 << (i % 9);  // All block sizes from 4x4, 8x4 ..64x64
    for (int k = 0; k < 9; k++) {
      for (int j = 0; j < block_size; j++) {
        if (k < 5) {
          if (rnd(2)) {
            // Positive number
            coeff[j] = rnd(1 << msb);
            dqcoeff[j] = rnd(1 << msb);
          } else {
            // Negative number
            coeff[j] = -rnd(1 << msb);
            dqcoeff[j] = -rnd(1 << msb);
          }
        } else {
          if (rnd(2)) {
            // Positive number
            coeff[j] = rnd(1 << 14);
            dqcoeff[j] = rnd(1 << 14);
          } else {
            // Negative number
            coeff[j] = -rnd(1 << 14);
            dqcoeff[j] = -rnd(1 << 14);
          }
        }
      }
      aom_usec_timer ref_timer, test_timer;

      aom_usec_timer_start(&ref_timer);
      for (int iter = 0; iter < num_iters; ++iter) {
        ref_error_block_op_(coeff, dqcoeff, block_size, &ref_ssz, bit_depth_);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int iter = 0; iter < num_iters; ++iter) {
        error_block_op_(coeff, dqcoeff, block_size, &ssz, bit_depth_);
      }
      aom_usec_timer_mark(&test_timer);

      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          " c_time=%d \t simd_time=%d \t "
          "gain=%d \n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    }
  }
}